

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O1

void __thiscall dlib::tt::tensor_rand::tensor_rand(tensor_rand *this,unsigned_long_long seed)

{
  string local_38;
  unsigned_long_long local_18;
  
  local_18 = seed;
  rand::rand(&this->rnd);
  cast_to_string<unsigned_long_long>(&local_38,&local_18);
  rand::set_seed(&this->rnd,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

tensor_rand::
    tensor_rand(
        unsigned long long seed
    ) 
#ifdef DLIB_USE_CUDA
    :rnd(seed){}